

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall Client::Client(Client *this,string *address,int port)

{
  int port_local;
  string *address_local;
  Client *this_local;
  
  TCP::TCP(&this->super_TCP);
  (this->super_TCP)._vptr_TCP = (_func_int **)&PTR_Connect_00107d18;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->collocutor);
  std::__cxx11::string::string((string *)&this->ip);
  std::__cxx11::string::operator=((string *)&this->ip,(string *)address);
  this->port = port;
  std::operator<<((ostream *)&std::cout,"[!] Write your nickname: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&this->name);
  std::operator<<((ostream *)&std::cout,"[!] Choose your friend: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&this->collocutor);
  return;
}

Assistant:

Client::Client(std::string address, int port) {
    this->ip = address;
    this->port = port;

    std::cout << "[!] Write your nickname: ";
    std::getline(std::cin, this->name);
    std::cout << "[!] Choose your friend: ";
    std::getline(std::cin, this->collocutor);
}